

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderCase.cpp
# Opt level: O0

void __thiscall
deqp::egl::RenderCase::executeForConfig(RenderCase *this,EGLDisplay display,EGLConfig config)

{
  TestContext *this_00;
  TestLog *pTVar1;
  EGLConfig pvVar2;
  Visibility visibility_;
  int iVar3;
  deUint32 err;
  qpTestResult qVar4;
  NativeDisplayFactory *factory;
  NativeDisplay *nativeDisplay_00;
  CommandLine *pCVar5;
  NativeWindowFactory *pNVar6;
  NativeWindow *window_00;
  EGLSurface pvVar7;
  element_type *peVar8;
  char *description;
  TestError *e_2;
  undefined1 local_4c0 [8];
  UniqueSurface surface_2;
  EGLint surfaceAttribs [5];
  string local_488;
  allocator<char> local_461;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400;
  allocator<char> local_3d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  ScopedLogSection local_378 [2];
  TestError *e_1;
  undefined1 local_358 [8];
  UniqueSurface surface_1;
  EGLSurface eglSurface_1;
  auto_ptr<eglu::NativePixmap> pixmap;
  NativePixmapFactory *pixmapFactory;
  allocator<char> local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  allocator<char> local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ScopedLogSection local_218 [2];
  TestError *e;
  undefined1 local_1f8 [8];
  UniqueSurface surface;
  EGLSurface eglSurface;
  undefined1 local_1d0 [8];
  UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> window;
  WindowParams params;
  NativeWindowFactory *windowFactory;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ScopedLogSection local_98 [3];
  allocator<char> local_79;
  string local_78 [8];
  string failReason;
  bool isOk;
  NativeDisplay *nativeDisplay;
  NativeDisplayFactory *displayFactory;
  undefined4 local_38;
  EGLint configId;
  int height;
  int width;
  TestLog *log;
  Library *egl;
  EGLConfig config_local;
  EGLDisplay display_local;
  RenderCase *this_local;
  
  egl = (Library *)config;
  config_local = display;
  display_local = this;
  log = (TestLog *)
        EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  _height = tcu::TestContext::getLog
                      ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  configId = 0x80;
  local_38 = 0x80;
  displayFactory._4_4_ = eglu::getConfigID((Library *)log,config_local,egl);
  factory = EglTestContext::getNativeDisplayFactory
                      ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  nativeDisplay_00 =
       EglTestContext::getNativeDisplay((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  failReason.field_2._M_local_buf[0xf] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"",&local_79);
  std::allocator<char>::~allocator(&local_79);
  pTVar1 = _height;
  if ((this->m_surfaceTypeMask & 4U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Config",&local_f9);
    de::toString<int>(&local_120,(int *)((long)&displayFactory + 4));
    std::operator+(&local_d8,&local_f8,&local_120);
    std::operator+(&local_b8,&local_d8,"-Window");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"Config ID ",&local_181)
    ;
    de::toString<int>((string *)&windowFactory,(int *)((long)&displayFactory + 4));
    std::operator+(&local_160,&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &windowFactory);
    std::operator+(&local_140,&local_160,", window surface");
    tcu::ScopedLogSection::ScopedLogSection(local_98,pTVar1,&local_b8,&local_140);
    tcu::ScopedLogSection::~ScopedLogSection(local_98);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&windowFactory);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    pCVar5 = tcu::TestContext::getCommandLine
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    pNVar6 = eglu::selectNativeWindowFactory(factory,pCVar5);
    pCVar5 = tcu::TestContext::getCommandLine
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    visibility_ = eglu::parseWindowVisibility(pCVar5);
    eglu::WindowParams::WindowParams
              ((WindowParams *)
               &window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                .m_data.field_0xc,0x80,0x80,visibility_);
    iVar3 = (*(pNVar6->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (pNVar6,nativeDisplay_00,config_local,egl,0,
                       &window.
                        super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                        .m_data.field_0xc);
    de::DefaultDeleter<eglu::NativeWindow>::DefaultDeleter
              ((DefaultDeleter<eglu::NativeWindow> *)((long)&eglSurface + 7));
    de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::UniquePtr
              ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_1d0,
               iVar3);
    window_00 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                ::operator*((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                             *)local_1d0);
    surface.m_surface =
         eglu::createWindowSurface(nativeDisplay_00,window_00,config_local,egl,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface
              ((UniqueSurface *)local_1f8,(Library *)log,config_local,surface.m_surface);
    pvVar2 = config_local;
    pvVar7 = eglu::UniqueSurface::operator*((UniqueSurface *)local_1f8);
    Config::Config((Config *)&e,egl,4,0);
    (*(this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,pvVar2,pvVar7,&e);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_1f8);
    de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::~UniquePtr
              ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_1d0);
  }
  pTVar1 = _height;
  if ((this->m_surfaceTypeMask & 2U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"Config",&local_279);
    de::toString<int>(&local_2a0,(int *)((long)&displayFactory + 4));
    std::operator+(&local_258,&local_278,&local_2a0);
    std::operator+(&local_238,&local_258,"-Pixmap");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"Config ID ",&local_301)
    ;
    de::toString<int>((string *)&pixmapFactory,(int *)((long)&displayFactory + 4));
    std::operator+(&local_2e0,&local_300,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &pixmapFactory);
    std::operator+(&local_2c0,&local_2e0,", pixmap surface");
    tcu::ScopedLogSection::ScopedLogSection(local_218,pTVar1,&local_238,&local_2c0);
    tcu::ScopedLogSection::~ScopedLogSection(local_218);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&pixmapFactory);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    pCVar5 = tcu::TestContext::getCommandLine
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    pixmap._M_ptr = (NativePixmap *)eglu::selectNativePixmapFactory(factory,pCVar5);
    peVar8 = (element_type *)
             (**(code **)(*(long *)pixmap._M_ptr + 0x20))
                       (pixmap._M_ptr,nativeDisplay_00,config_local,egl,0,0x80,0x80);
    std::auto_ptr<eglu::NativePixmap>::auto_ptr
              ((auto_ptr<eglu::NativePixmap> *)&eglSurface_1,peVar8);
    peVar8 = std::auto_ptr<eglu::NativePixmap>::operator*
                       ((auto_ptr<eglu::NativePixmap> *)&eglSurface_1);
    surface_1.m_surface =
         eglu::createPixmapSurface(nativeDisplay_00,peVar8,config_local,egl,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface
              ((UniqueSurface *)local_358,(Library *)log,config_local,surface_1.m_surface);
    pvVar2 = config_local;
    pvVar7 = eglu::UniqueSurface::operator*((UniqueSurface *)local_358);
    Config::Config((Config *)&e_1,egl,2,0);
    (*(this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,pvVar2,pvVar7,&e_1);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_358);
    std::auto_ptr<eglu::NativePixmap>::~auto_ptr((auto_ptr<eglu::NativePixmap> *)&eglSurface_1);
  }
  pTVar1 = _height;
  if ((this->m_surfaceTypeMask & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"Config",&local_3d9);
    de::toString<int>(&local_400,(int *)((long)&displayFactory + 4));
    std::operator+(&local_3b8,&local_3d8,&local_400);
    std::operator+(&local_398,&local_3b8,"-Pbuffer");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"Config ID ",&local_461)
    ;
    de::toString<int>(&local_488,(int *)((long)&displayFactory + 4));
    std::operator+(&local_440,&local_460,&local_488);
    std::operator+(&local_420,&local_440,", pbuffer surface");
    tcu::ScopedLogSection::ScopedLogSection(local_378,pTVar1,&local_398,&local_420);
    tcu::ScopedLogSection::~ScopedLogSection(local_378);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::allocator<char>::~allocator(&local_3d9);
    pvVar2 = config_local;
    pTVar1 = log;
    surface_2.m_surface._0_4_ = 0x3057;
    surface_2.m_surface._4_4_ = 0x80;
    pvVar7 = (EGLSurface)(**(code **)(log->m_log + 2))(log,config_local,egl,&surface_2.m_surface);
    eglu::UniqueSurface::UniqueSurface((UniqueSurface *)local_4c0,(Library *)pTVar1,pvVar2,pvVar7);
    err = (*(code *)log->m_log[6].lock)();
    eglu::checkError(err,"eglCreatePbufferSurface()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                     ,0xbe);
    pvVar2 = config_local;
    pvVar7 = eglu::UniqueSurface::operator*((UniqueSurface *)local_4c0);
    Config::Config((Config *)&e_2,egl,1,0);
    (*(this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,pvVar2,pvVar7,&e_2);
    eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)local_4c0);
  }
  if ((failReason.field_2._M_local_buf[0xf] & 1U) == 0) {
    qVar4 = tcu::TestContext::getTestResult
                      ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
    if (qVar4 == QP_TEST_RESULT_PASS) {
      this_00 = (this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx;
      description = (char *)std::__cxx11::string::c_str();
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,description);
    }
  }
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void RenderCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&						log				= m_testCtx.getLog();
	const int							width			= 128;
	const int							height			= 128;
	const EGLint						configId		= eglu::getConfigID(egl, display, config);

	const eglu::NativeDisplayFactory&	displayFactory	= m_eglTestCtx.getNativeDisplayFactory();
	eglu::NativeDisplay&				nativeDisplay	= m_eglTestCtx.getNativeDisplay();

	bool								isOk			= true;
	string								failReason		= "";

	if (m_surfaceTypeMask & EGL_WINDOW_BIT)
	{
		tcu::ScopedLogSection(log,
							  string("Config") + de::toString(configId) + "-Window",
							  string("Config ID ") + de::toString(configId) + ", window surface");

		const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(displayFactory, m_testCtx.getCommandLine());

		try
		{
			const eglu::WindowParams			params		(width, height, eglu::parseWindowVisibility(m_testCtx.getCommandLine()));
			de::UniquePtr<eglu::NativeWindow>	window		(windowFactory.createWindow(&nativeDisplay, display, config, DE_NULL, params));
			EGLSurface							eglSurface	= createWindowSurface(nativeDisplay, *window, display, config, DE_NULL);
			eglu::UniqueSurface					surface		(egl, display, eglSurface);

			executeForSurface(display, *surface, Config(config, EGL_WINDOW_BIT, 0));
		}
		catch (const tcu::TestError& e)
		{
			log << e;
			isOk = false;
			failReason = e.what();
		}
	}

	if (m_surfaceTypeMask & EGL_PIXMAP_BIT)
	{
		tcu::ScopedLogSection(log,
							  string("Config") + de::toString(configId) + "-Pixmap",
							  string("Config ID ") + de::toString(configId) + ", pixmap surface");

		const eglu::NativePixmapFactory&	pixmapFactory	= eglu::selectNativePixmapFactory(displayFactory, m_testCtx.getCommandLine());

		try
		{
			std::auto_ptr<eglu::NativePixmap>	pixmap		(pixmapFactory.createPixmap(&nativeDisplay, display, config, DE_NULL, width, height));
			EGLSurface							eglSurface	= createPixmapSurface(nativeDisplay, *pixmap, display, config, DE_NULL);
			eglu::UniqueSurface					surface		(egl, display, eglSurface);

			executeForSurface(display, *surface, Config(config, EGL_PIXMAP_BIT, 0));
		}
		catch (const tcu::TestError& e)
		{
			log << e;
			isOk = false;
			failReason = e.what();
		}
	}

	if (m_surfaceTypeMask & EGL_PBUFFER_BIT)
	{
		tcu::ScopedLogSection(log,
							  string("Config") + de::toString(configId) + "-Pbuffer",
							  string("Config ID ") + de::toString(configId) + ", pbuffer surface");
		try
		{
			const EGLint surfaceAttribs[] =
			{
				EGL_WIDTH,	width,
				EGL_HEIGHT,	height,
				EGL_NONE
			};

			eglu::UniqueSurface surface(egl, display, egl.createPbufferSurface(display, config, surfaceAttribs));
			EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface()");

			executeForSurface(display, *surface, Config(config, EGL_PBUFFER_BIT, 0));
		}
		catch (const tcu::TestError& e)
		{
			log << e;
			isOk = false;
			failReason = e.what();
		}
	}

	if (!isOk && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, failReason.c_str());
}